

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_split_qua(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  int iVar1;
  REF_CELL ref_cell;
  uint uVar2;
  REF_STATUS RVar3;
  void *__s;
  REF_INT *pRVar4;
  ulong uVar5;
  int iVar6;
  undefined8 uVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  REF_INT edge30;
  REF_INT edge12;
  REF_INT new_cell;
  REF_CELL ref_cell_split;
  REF_INT edge23;
  REF_INT edge01;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  int local_134;
  int local_130;
  REF_INT local_12c;
  REF_CELL local_128;
  int local_120;
  int local_11c;
  REF_INT local_118;
  REF_INT local_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c [27];
  
  ref_cell = ref_subdiv->grid->cell[6];
  iVar8 = ref_cell->max;
  if ((long)iVar8 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x414,
           "ref_subdiv_split_qua","malloc marked_for_removal of REF_INT negative");
    return 1;
  }
  __size = (long)iVar8 * 4;
  __s = malloc(__size);
  if (__s == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x414,
           "ref_subdiv_split_qua","malloc marked_for_removal of REF_INT NULL");
    return 2;
  }
  if (iVar8 != 0) {
    memset(__s,0,__size);
  }
  uVar2 = ref_cell_create(&local_128,ref_cell->type);
  if (uVar2 != 0) {
    pcVar9 = "temp cell";
    uVar7 = 0x416;
    goto LAB_001c03b8;
  }
  if (0 < ref_cell->max) {
    lVar10 = 0;
LAB_001c044b:
    iVar8 = (int)lVar10;
    if (ref_cell->c2n[(long)iVar8 * (long)ref_cell->size_per] == -1) {
LAB_001c073f:
      lVar10 = lVar10 + 1;
      uVar5 = (ulong)ref_cell->max;
      if ((long)uVar5 <= lVar10) goto code_r0x001c0750;
      goto LAB_001c044b;
    }
    uVar2 = ref_cell_nodes(ref_cell,iVar8,&local_118);
    if (uVar2 != 0) {
      pcVar9 = "nodes";
      uVar7 = 0x419;
      goto LAB_001c03b8;
    }
    uVar2 = ref_edge_with(ref_subdiv->edge,local_118,local_114,&local_11c);
    if (uVar2 != 0) {
      pcVar9 = "e01";
      uVar7 = 0x41b;
      goto LAB_001c03b8;
    }
    uVar2 = ref_edge_with(ref_subdiv->edge,local_114,local_110,&local_130);
    if (uVar2 != 0) {
      pcVar9 = "e12";
      uVar7 = 0x41d;
      goto LAB_001c03b8;
    }
    uVar2 = ref_edge_with(ref_subdiv->edge,local_110,local_10c,&local_120);
    if (uVar2 != 0) {
      pcVar9 = "e23";
      uVar7 = 0x41f;
      goto LAB_001c03b8;
    }
    uVar2 = ref_edge_with(ref_subdiv->edge,local_10c,local_118,&local_134);
    if (uVar2 != 0) {
      pcVar9 = "e30";
      uVar7 = 0x421;
      goto LAB_001c03b8;
    }
    pRVar4 = ref_subdiv->mark;
    iVar1 = pRVar4[local_11c];
    if (iVar1 == 0) {
LAB_001c0530:
      if ((iVar1 == pRVar4[local_120]) && (iVar6 = pRVar4[local_130], iVar6 == pRVar4[local_134])) {
        if (iVar1 != 0) {
          *(undefined4 *)((long)__s + lVar10 * 4) = 1;
          uVar2 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
          if (uVar2 != 0) {
            pcVar9 = "nodes";
            uVar7 = 0x431;
            goto LAB_001c03b8;
          }
          uVar2 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
          if (uVar2 != 0) {
            pcVar9 = "mis";
            uVar7 = 0x434;
            goto LAB_001c03b8;
          }
          uVar2 = ref_subdiv_node_between(ref_subdiv,local_110,local_10c,&local_a0);
          if (uVar2 != 0) {
            pcVar9 = "mis";
            uVar7 = 0x437;
            goto LAB_001c03b8;
          }
          uVar2 = ref_cell_add(local_128,&local_a8,&local_12c);
          if (uVar2 != 0) {
            pcVar9 = "add";
            uVar7 = 0x438;
            goto LAB_001c03b8;
          }
          uVar2 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
          if (uVar2 != 0) {
            pcVar9 = "nodes";
            uVar7 = 0x43a;
            goto LAB_001c03b8;
          }
          uVar2 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
          if (uVar2 != 0) {
            pcVar9 = "mis";
            uVar7 = 0x43d;
            goto LAB_001c03b8;
          }
          uVar2 = ref_subdiv_node_between(ref_subdiv,local_110,local_10c,local_9c);
          if (uVar2 != 0) {
            pcVar9 = "mis";
            uVar7 = 0x440;
            goto LAB_001c03b8;
          }
          uVar2 = ref_cell_add(local_128,&local_a8,&local_12c);
          if (uVar2 != 0) {
            pcVar9 = "add";
            uVar7 = 0x441;
            goto LAB_001c03b8;
          }
          pRVar4 = ref_subdiv->mark;
          iVar6 = pRVar4[local_130];
        }
        if ((iVar6 != 0) && (pRVar4[local_134] != 0)) {
          *(undefined4 *)((long)__s + lVar10 * 4) = 1;
          uVar2 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
          if (uVar2 == 0) {
            uVar2 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
            if (uVar2 == 0) {
              uVar2 = ref_subdiv_node_between(ref_subdiv,local_10c,local_118,local_9c);
              if (uVar2 == 0) {
                uVar2 = ref_cell_add(local_128,&local_a8,&local_12c);
                if (uVar2 == 0) {
                  uVar2 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                  if (uVar2 == 0) {
                    uVar2 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a4);
                    if (uVar2 == 0) {
                      uVar2 = ref_subdiv_node_between(ref_subdiv,local_10c,local_118,&local_a8);
                      if (uVar2 == 0) {
                        uVar2 = ref_cell_add(local_128,&local_a8,&local_12c);
                        if (uVar2 == 0) goto LAB_001c073f;
                        pcVar9 = "add";
                        uVar7 = 0x458;
                      }
                      else {
                        pcVar9 = "mis";
                        uVar7 = 0x457;
                      }
                    }
                    else {
                      pcVar9 = "mis";
                      uVar7 = 0x454;
                    }
                  }
                  else {
                    pcVar9 = "nodes";
                    uVar7 = 0x451;
                  }
                }
                else {
                  pcVar9 = "add";
                  uVar7 = 0x44f;
                }
              }
              else {
                pcVar9 = "mis";
                uVar7 = 0x44e;
              }
            }
            else {
              pcVar9 = "mis";
              uVar7 = 1099;
            }
          }
          else {
            pcVar9 = "nodes";
            uVar7 = 0x448;
          }
          goto LAB_001c03b8;
        }
        goto LAB_001c073f;
      }
LAB_001c07ff:
      pcVar9 = "quad edges not paired";
      uVar7 = 0x42b;
    }
    else {
      if (pRVar4[local_120] == 0) goto LAB_001c07ff;
      if ((pRVar4[local_130] == 0) || (pRVar4[local_134] == 0)) goto LAB_001c0530;
      pcVar9 = "all quad edges";
      uVar7 = 0x426;
    }
    uVar2 = 6;
    uVar5 = 6;
    goto LAB_001c03bb;
  }
  goto LAB_001c0781;
code_r0x001c0750:
  if (0 < ref_cell->max) {
    lVar10 = 0;
    do {
      if (*(int *)((long)__s + lVar10 * 4) == 1) {
        uVar2 = ref_cell_remove(ref_cell,(REF_INT)lVar10);
        if (uVar2 != 0) {
          pcVar9 = "remove";
          uVar7 = 0x45e;
          goto LAB_001c03b8;
        }
        uVar5 = (ulong)(uint)ref_cell->max;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)uVar5);
  }
LAB_001c0781:
  if (0 < local_128->max) {
    iVar8 = 0;
    do {
      RVar3 = ref_cell_nodes(local_128,iVar8,&local_118);
      if ((RVar3 == 0) &&
         (uVar2 = ref_subdiv_add_local_cell((REF_SUBDIV)ref_subdiv->grid,ref_cell,&local_118),
         uVar2 != 0)) {
        pcVar9 = "add local";
        uVar7 = 0x461;
        goto LAB_001c03b8;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_128->max);
  }
  uVar2 = ref_cell_free(local_128);
  if (uVar2 == 0) {
    free(__s);
    return 0;
  }
  pcVar9 = "temp ref_cell free";
  uVar7 = 0x463;
LAB_001c03b8:
  uVar5 = (ulong)uVar2;
LAB_001c03bb:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar7,
         "ref_subdiv_split_qua",uVar5,pcVar9);
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_qua(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01, edge12, edge23, edge30;

  ref_cell = ref_grid_qua(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[1], nodes[2], &edge12),
        "e12");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[2], nodes[3], &edge23),
        "e23");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[3], nodes[0], &edge30),
        "e30");
    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge23) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge30))
      RSS(REF_IMPLEMENT, "all quad edges");
    if (ref_subdiv_mark(ref_subdiv, edge01) !=
            ref_subdiv_mark(ref_subdiv, edge23) ||
        ref_subdiv_mark(ref_subdiv, edge12) !=
            ref_subdiv_mark(ref_subdiv, edge30))
      RSS(REF_IMPLEMENT, "quad edges not paired");

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge23)) {
      marked_for_removal[cell] = 1;

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge30)) {
      marked_for_removal[cell] = 1;

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[0],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}